

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O1

void __thiscall
Centaurus::ATNMachine<wchar_t>::parse_selection(ATNMachine<wchar_t> *this,Stream *stream)

{
  pointer pAVar1;
  pointer pAVar2;
  wchar_t *pwVar3;
  bool bVar4;
  pointer piVar5;
  wchar_t ch;
  StreamException *__return_storage_ptr__;
  int priority;
  pointer piVar6;
  vector<int,_std::allocator<int>_> terminal_states;
  int local_50 [2];
  vector<int,_std::allocator<int>_> local_48;
  
  priority = 0;
  add_node(this,(int)((ulong)((long)(this->m_nodes).
                                    super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_nodes).
                                   super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b +
                -1,0);
  pAVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar2 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  do {
    local_50[0] = add_node(this,(int)((ulong)((long)pAVar1 - (long)pAVar2) >> 3) * 0x286bca1b + -1,
                           priority);
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_48,
                 (iterator)
                 local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_50);
    }
    else {
      *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_50[0];
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    parse_sequence(this,stream);
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    [-1] = (int)((ulong)((long)(this->m_nodes).
                               super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_nodes).
                              super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b + -1;
    ch = Stream::skip_whitespace(stream);
    bVar4 = true;
    if ((ch != L')') && (ch != L';')) {
      if (ch != L'|') {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,ch);
        __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                    StreamException::~StreamException);
      }
      Stream::get(stream);
      pwVar3 = (stream->m_cur)._M_current;
      if ((pwVar3 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) &&
         (*pwVar3 == L'>')) {
        Stream::get(stream);
        priority = priority + 1;
      }
      bVar4 = false;
    }
  } while (!bVar4);
  std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
  emplace_back<>(&this->m_nodes);
  piVar5 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pAVar1 = (this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pAVar2 = (this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      local_50[1] = 0;
      local_50[0] = (int)((ulong)((long)pAVar1 - (long)pAVar2) >> 3) * 0x286bca1b + -1;
      std::
      vector<Centaurus::ATNTransition<wchar_t>,std::allocator<Centaurus::ATNTransition<wchar_t>>>::
      emplace_back<int&,int&>
                ((vector<Centaurus::ATNTransition<wchar_t>,std::allocator<Centaurus::ATNTransition<wchar_t>>>
                  *)&(this->m_nodes).
                     super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[*piVar6].m_transitions,local_50,
                 local_50 + 1);
      piVar6 = piVar6 + 1;
    } while (piVar6 != piVar5);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ATNMachine<TCHAR>::parse_selection(Stream& stream)
{
    add_node(m_nodes.size() - 1);

    int priority = 0;
	int origin_state = m_nodes.size() - 1;
	std::vector<int> terminal_states;
	
	for (;;)
	{
		terminal_states.push_back(add_node(origin_state, priority));

		parse_sequence(stream);

		terminal_states.back() = m_nodes.size() - 1;

		wchar_t ch = stream.skip_whitespace();
		if (ch == L';' || ch == L')')
		{
			break;
		}
		else if (ch == L'|')
		{
			stream.discard();
            ch = stream.peek();
            if (ch == L'>')
            {
                stream.discard();

                priority++;
            }
			continue;
		}
		else
		{
			throw stream.unexpected(ch);
		}
	}

	m_nodes.emplace_back();
	int final_node = m_nodes.size() - 1;
	for (int from : terminal_states)
	{
		m_nodes[from].add_transition(final_node);
	}
}